

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zopflipng_lib.cc
# Opt level: O0

void CZopfliPNGSetDefaults(CZopfliPNGOptions *png_options)

{
  uint *in_RDI;
  ZopfliPNGOptions opts;
  byte local_57;
  byte local_56;
  ZopfliPNGOptions *in_stack_ffffffffffffffb0;
  byte local_38;
  byte local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  memset(in_RDI,0,0x38);
  ZopfliPNGOptions::ZopfliPNGOptions(in_stack_ffffffffffffffb0);
  *in_RDI = (uint)(local_57 & 1);
  in_RDI[1] = (uint)(local_56 & 1);
  in_RDI[5] = (uint)(local_38 & 1);
  in_RDI[9] = (uint)(local_18 & 1);
  in_RDI[10] = local_14;
  in_RDI[0xb] = local_10;
  in_RDI[0xc] = local_c;
  ZopfliPNGOptions::~ZopfliPNGOptions(in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void CZopfliPNGSetDefaults(CZopfliPNGOptions* png_options) {

  memset(png_options, 0, sizeof(*png_options));
  // Constructor sets the defaults
  ZopfliPNGOptions opts;

  png_options->lossy_transparent    = opts.lossy_transparent;
  png_options->lossy_8bit           = opts.lossy_8bit;
  png_options->auto_filter_strategy = opts.auto_filter_strategy;
  png_options->use_zopfli           = opts.use_zopfli;
  png_options->num_iterations       = opts.num_iterations;
  png_options->num_iterations_large = opts.num_iterations_large;
  png_options->block_split_strategy = opts.block_split_strategy;
}